

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ClearStatTables(Parse *pParse,int iDb,char *zType,char *zName)

{
  Table *pTVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  Parse *in_RDI;
  char zTab [24];
  char *zDbName;
  int i;
  char acStack_48 [16];
  char *in_stack_ffffffffffffffc8;
  char *zName_00;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  
  zName_00 = in_RDI->db->aDb[in_ESI].zDbSName;
  for (uVar2 = 1; (int)uVar2 < 5; uVar2 = uVar2 + 1) {
    sqlite3_snprintf(0x18,acStack_48,"sqlite_stat%d",(ulong)uVar2);
    pTVar1 = sqlite3FindTable((sqlite3 *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),zName_00,
                              in_stack_ffffffffffffffc8);
    if (pTVar1 != (Table *)0x0) {
      sqlite3NestedParse(in_RDI,"DELETE FROM %Q.%s WHERE %s=%Q",zName_00,acStack_48,in_RDX,in_RCX);
    }
  }
  return;
}

Assistant:

static void sqlite3ClearStatTables(
  Parse *pParse,         /* The parsing context */
  int iDb,               /* The database number */
  const char *zType,     /* "idx" or "tbl" */
  const char *zName      /* Name of index or table */
){
  int i;
  const char *zDbName = pParse->db->aDb[iDb].zDbSName;
  for(i=1; i<=4; i++){
    char zTab[24];
    sqlite3_snprintf(sizeof(zTab),zTab,"sqlite_stat%d",i);
    if( sqlite3FindTable(pParse->db, zTab, zDbName) ){
      sqlite3NestedParse(pParse,
        "DELETE FROM %Q.%s WHERE %s=%Q",
        zDbName, zTab, zType, zName
      );
    }
  }
}